

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatorprofile.cpp
# Opt level: O1

string * __thiscall
libcellml::GeneratorProfile::implementationComputeVariablesMethodString_abi_cxx11_
          (string *__return_storage_ptr__,GeneratorProfile *this,bool forDifferentialModel,
          bool withExternalVariables)

{
  GeneratorProfileImpl *pGVar1;
  long lVar2;
  undefined7 in_register_00000009;
  ulong uVar3;
  long lVar4;
  undefined7 in_register_00000011;
  
  pGVar1 = this->mPimpl;
  uVar3 = (ulong)(uint)((int)CONCAT71(in_register_00000009,withExternalVariables) << 6);
  lVar4 = uVar3 + 0x13f0;
  lVar2 = uVar3 + 0x13e8;
  if ((int)CONCAT71(in_register_00000011,forDifferentialModel) != 0) {
    lVar4 = uVar3 + 0x1470;
    lVar2 = uVar3 + 0x1468;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  lVar2 = *(long *)((long)&pGVar1->mProfile + lVar2);
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,lVar2,
             *(long *)((long)&pGVar1->mProfile + lVar4) + lVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string GeneratorProfile::implementationComputeVariablesMethodString(bool forDifferentialModel,
                                                                         bool withExternalVariables) const
{
    if (forDifferentialModel) {
        if (withExternalVariables) {
            return mPimpl->mImplementationComputeVariablesMethodFdmWevString;
        }

        return mPimpl->mImplementationComputeVariablesMethodFdmWoevString;
    }

    if (withExternalVariables) {
        return mPimpl->mImplementationComputeVariablesMethodFamWevString;
    }

    return mPimpl->mImplementationComputeVariablesMethodFamWoevString;
}